

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O2

bool __thiscall
wallet::WalletBatch::WriteCryptedKey
          (WalletBatch *this,CPubKey *vchPubKey,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *vchCryptedSecret,
          CKeyMetadata *keyMeta)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> val;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CPubKey>
  local_118;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CPubKey> key
  ;
  uint256 checksum;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = WriteKeyMetadata(this,keyMeta,vchPubKey,true);
  if (!bVar2) {
    bVar2 = false;
    goto LAB_00492776;
  }
  Hash<std::vector<unsigned_char,std::allocator<unsigned_char>>>(&checksum,vchCryptedSecret);
  std::__cxx11::string::string
            ((string *)&key,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             DBKeys::CRYPTED_KEY_abi_cxx11_);
  memcpy(&key.second,vchPubKey,0x41);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_118,vchCryptedSecret);
  local_118.second.vch[8] = checksum.super_base_blob<256U>.m_data._M_elems[0x10];
  local_118.second.vch[9] = checksum.super_base_blob<256U>.m_data._M_elems[0x11];
  local_118.second.vch[10] = checksum.super_base_blob<256U>.m_data._M_elems[0x12];
  local_118.second.vch[0xb] = checksum.super_base_blob<256U>.m_data._M_elems[0x13];
  local_118.second.vch[0xc] = checksum.super_base_blob<256U>.m_data._M_elems[0x14];
  local_118.second.vch[0xd] = checksum.super_base_blob<256U>.m_data._M_elems[0x15];
  local_118.second.vch[0xe] = checksum.super_base_blob<256U>.m_data._M_elems[0x16];
  local_118.second.vch[0xf] = checksum.super_base_blob<256U>.m_data._M_elems[0x17];
  local_118.second.vch[0x10] = checksum.super_base_blob<256U>.m_data._M_elems[0x18];
  local_118.second.vch[0x11] = checksum.super_base_blob<256U>.m_data._M_elems[0x19];
  local_118.second.vch[0x12] = checksum.super_base_blob<256U>.m_data._M_elems[0x1a];
  local_118.second.vch[0x13] = checksum.super_base_blob<256U>.m_data._M_elems[0x1b];
  local_118.second.vch[0x14] = checksum.super_base_blob<256U>.m_data._M_elems[0x1c];
  local_118.second.vch[0x15] = checksum.super_base_blob<256U>.m_data._M_elems[0x1d];
  local_118.second.vch[0x16] = checksum.super_base_blob<256U>.m_data._M_elems[0x1e];
  local_118.second.vch[0x17] = checksum.super_base_blob<256U>.m_data._M_elems[0x1f];
  local_118.first.field_2._M_local_buf[8] = checksum.super_base_blob<256U>.m_data._M_elems[0];
  local_118.first.field_2._M_local_buf[9] = checksum.super_base_blob<256U>.m_data._M_elems[1];
  local_118.first.field_2._M_local_buf[10] = checksum.super_base_blob<256U>.m_data._M_elems[2];
  local_118.first.field_2._M_local_buf[0xb] = checksum.super_base_blob<256U>.m_data._M_elems[3];
  local_118.first.field_2._M_local_buf[0xc] = checksum.super_base_blob<256U>.m_data._M_elems[4];
  local_118.first.field_2._M_local_buf[0xd] = checksum.super_base_blob<256U>.m_data._M_elems[5];
  local_118.first.field_2._M_local_buf[0xe] = checksum.super_base_blob<256U>.m_data._M_elems[6];
  local_118.first.field_2._M_local_buf[0xf] = checksum.super_base_blob<256U>.m_data._M_elems[7];
  local_118.second.vch[0] = checksum.super_base_blob<256U>.m_data._M_elems[8];
  local_118.second.vch[1] = checksum.super_base_blob<256U>.m_data._M_elems[9];
  local_118.second.vch[2] = checksum.super_base_blob<256U>.m_data._M_elems[10];
  local_118.second.vch[3] = checksum.super_base_blob<256U>.m_data._M_elems[0xb];
  local_118.second.vch[4] = checksum.super_base_blob<256U>.m_data._M_elems[0xc];
  local_118.second.vch[5] = checksum.super_base_blob<256U>.m_data._M_elems[0xd];
  local_118.second.vch[6] = checksum.super_base_blob<256U>.m_data._M_elems[0xe];
  local_118.second.vch[7] = checksum.super_base_blob<256U>.m_data._M_elems[0xf];
  bVar2 = WriteIC<std::pair<std::__cxx11::string,CPubKey>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,uint256>>
                    (this,&key,
                     (pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_uint256> *)
                     &local_118,false);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_118);
  if (bVar2) {
LAB_0049269b:
    std::__cxx11::string::string
              ((string *)&local_118,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               DBKeys::KEY_abi_cxx11_);
    memcpy(&local_118.second,vchPubKey,0x41);
    EraseIC<std::pair<std::__cxx11::string,CPubKey>>(this,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    bVar2 = true;
  }
  else {
    val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar2 = DatabaseBatch::
            Read<std::pair<std::__cxx11::string,CPubKey>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ((this->m_batch)._M_t.
                       super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                       .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl,&key,&val
                      );
    if (bVar2) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_118,&val);
      local_118.second.vch[8] = checksum.super_base_blob<256U>.m_data._M_elems[0x10];
      local_118.second.vch[9] = checksum.super_base_blob<256U>.m_data._M_elems[0x11];
      local_118.second.vch[10] = checksum.super_base_blob<256U>.m_data._M_elems[0x12];
      local_118.second.vch[0xb] = checksum.super_base_blob<256U>.m_data._M_elems[0x13];
      local_118.second.vch[0xc] = checksum.super_base_blob<256U>.m_data._M_elems[0x14];
      local_118.second.vch[0xd] = checksum.super_base_blob<256U>.m_data._M_elems[0x15];
      local_118.second.vch[0xe] = checksum.super_base_blob<256U>.m_data._M_elems[0x16];
      local_118.second.vch[0xf] = checksum.super_base_blob<256U>.m_data._M_elems[0x17];
      local_118.second.vch[0x10] = checksum.super_base_blob<256U>.m_data._M_elems[0x18];
      local_118.second.vch[0x11] = checksum.super_base_blob<256U>.m_data._M_elems[0x19];
      local_118.second.vch[0x12] = checksum.super_base_blob<256U>.m_data._M_elems[0x1a];
      local_118.second.vch[0x13] = checksum.super_base_blob<256U>.m_data._M_elems[0x1b];
      local_118.second.vch[0x14] = checksum.super_base_blob<256U>.m_data._M_elems[0x1c];
      local_118.second.vch[0x15] = checksum.super_base_blob<256U>.m_data._M_elems[0x1d];
      local_118.second.vch[0x16] = checksum.super_base_blob<256U>.m_data._M_elems[0x1e];
      local_118.second.vch[0x17] = checksum.super_base_blob<256U>.m_data._M_elems[0x1f];
      local_118.first.field_2._M_local_buf[8] = checksum.super_base_blob<256U>.m_data._M_elems[0];
      local_118.first.field_2._M_local_buf[9] = checksum.super_base_blob<256U>.m_data._M_elems[1];
      local_118.first.field_2._M_local_buf[10] = checksum.super_base_blob<256U>.m_data._M_elems[2];
      local_118.first.field_2._M_local_buf[0xb] = checksum.super_base_blob<256U>.m_data._M_elems[3];
      local_118.first.field_2._M_local_buf[0xc] = checksum.super_base_blob<256U>.m_data._M_elems[4];
      local_118.first.field_2._M_local_buf[0xd] = checksum.super_base_blob<256U>.m_data._M_elems[5];
      local_118.first.field_2._M_local_buf[0xe] = checksum.super_base_blob<256U>.m_data._M_elems[6];
      local_118.first.field_2._M_local_buf[0xf] = checksum.super_base_blob<256U>.m_data._M_elems[7];
      local_118.second.vch[0] = checksum.super_base_blob<256U>.m_data._M_elems[8];
      local_118.second.vch[1] = checksum.super_base_blob<256U>.m_data._M_elems[9];
      local_118.second.vch[2] = checksum.super_base_blob<256U>.m_data._M_elems[10];
      local_118.second.vch[3] = checksum.super_base_blob<256U>.m_data._M_elems[0xb];
      local_118.second.vch[4] = checksum.super_base_blob<256U>.m_data._M_elems[0xc];
      local_118.second.vch[5] = checksum.super_base_blob<256U>.m_data._M_elems[0xd];
      local_118.second.vch[6] = checksum.super_base_blob<256U>.m_data._M_elems[0xe];
      local_118.second.vch[7] = checksum.super_base_blob<256U>.m_data._M_elems[0xf];
      bVar2 = WriteIC<std::pair<std::__cxx11::string,CPubKey>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,uint256>>
                        (this,&key,
                         (pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_uint256>
                          *)&local_118,true);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_118);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      if (bVar2) goto LAB_0049269b;
    }
    else {
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    }
    bVar2 = false;
  }
  std::__cxx11::string::~string((string *)&key);
LAB_00492776:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool WalletBatch::WriteCryptedKey(const CPubKey& vchPubKey,
                                const std::vector<unsigned char>& vchCryptedSecret,
                                const CKeyMetadata &keyMeta)
{
    if (!WriteKeyMetadata(keyMeta, vchPubKey, true)) {
        return false;
    }

    // Compute a checksum of the encrypted key
    uint256 checksum = Hash(vchCryptedSecret);

    const auto key = std::make_pair(DBKeys::CRYPTED_KEY, vchPubKey);
    if (!WriteIC(key, std::make_pair(vchCryptedSecret, checksum), false)) {
        // It may already exist, so try writing just the checksum
        std::vector<unsigned char> val;
        if (!m_batch->Read(key, val)) {
            return false;
        }
        if (!WriteIC(key, std::make_pair(val, checksum), true)) {
            return false;
        }
    }
    EraseIC(std::make_pair(DBKeys::KEY, vchPubKey));
    return true;
}